

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O3

unsigned_short __thiscall
PermutazioneI::ricercaBinaria
          (PermutazioneI *this,unsigned_short *vOrdinato,unsigned_short lunghezza,
          unsigned_short valore)

{
  ushort uVar1;
  uint uVar2;
  unsigned_short fine;
  undefined6 in_register_00000012;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar3 = CONCAT62(in_register_00000012,lunghezza);
  uVar2 = 0;
  uVar1 = 0;
  if ((int)uVar3 != 0) {
    do {
      uVar3 = uVar3 & 0xffff;
      uVar4 = (uVar2 & 0xffff) + (int)uVar3;
      uVar5 = uVar4 >> 1;
      bVar6 = valore <= *(ushort *)((long)vOrdinato + (ulong)(uVar4 & 0xfffffffe));
      if (bVar6) {
        uVar3 = (ulong)uVar5;
      }
      uVar2 = uVar2 & 0xffff;
      if (!bVar6) {
        uVar2 = uVar5 + 1;
      }
      uVar1 = (ushort)uVar2;
    } while (uVar1 < (ushort)uVar3);
  }
  return uVar1;
}

Assistant:

unsigned short PermutazioneI::ricercaBinaria(unsigned short* vOrdinato, unsigned short lunghezza, 
	unsigned short valore) {

	unsigned short inizio = 0, fine = lunghezza;
	unsigned int i;

	while (inizio < fine) {
		i = (inizio + fine) / 2;
		if (valore > vOrdinato[i])
			inizio = i + 1;
		else fine = i;
	}

	return inizio;
}